

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall adios2::core::engine::ssc::SscWriterGeneric::SyncReadPattern(SscWriterGeneric *this)

{
  uint8_t *puVar1;
  IO *pIVar2;
  IO *in_RDI;
  IO *m;
  int i;
  Buffer globalBuffer;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar3;
  size_t capacity;
  int iVar4;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 uVar5;
  int in_stack_fffffffffffffe4c;
  Buffer *in_stack_fffffffffffffe50;
  string *label;
  int local_17c;
  allocator *paVar6;
  allocator *paVar7;
  allocator *output;
  Buffer *in_stack_fffffffffffffeb0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *in_stack_fffffffffffffec0;
  string local_130 [36];
  int local_10c;
  BlockVec *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  RankPosMap *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  BlockVecVec *in_stack_ffffffffffffff30;
  BlockVecVec *in_stack_ffffffffffffff38;
  SscWriterGeneric *in_stack_ffffffffffffff40;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  output = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Engine",output);
  paVar7 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"SscWriter",paVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"SyncReadPattern",&local_89);
  paVar6 = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",paVar6);
  if (*(int *)(in_RDI + 0x78) < 10) {
    local_17c = 0;
  }
  else {
    local_17c = *(int *)(in_RDI + 0x28);
  }
  iVar4 = *(int *)(in_RDI + 0x78);
  uVar5 = 0x69;
  capacity = CONCAT44(uVar3,5);
  adios2::helper::Log(local_28,local_60,local_88,local_b0,local_17c,*(int *)(in_RDI + 0x28),5,iVar4,
                      INFO);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  Buffer::Buffer((Buffer *)CONCAT44(in_stack_fffffffffffffe44,iVar4),capacity);
  BroadcastMetadata(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                    (MPI_Comm)CONCAT44(in_stack_fffffffffffffe44,iVar4));
  puVar1 = Buffer::operator[]((Buffer *)&stack0xffffffffffffff30,1);
  in_RDI[0x159] = (IO)(*puVar1 != '\0');
  pIVar2 = in_RDI + 0x90;
  Deserialize(in_stack_fffffffffffffeb0,(BlockVecVec *)output,in_RDI,SUB81((ulong)paVar7 >> 0x38,0),
              SUB81((ulong)paVar7 >> 0x30,0),SUB81((ulong)paVar7 >> 0x28,0),
              in_stack_fffffffffffffec0);
  std::
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
  CalculateOverlap((BlockVecVec *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  m = in_RDI + 0x120;
  label = (string *)&stack0xfffffffffffffef8;
  std::
  unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::operator=((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe44,iVar4),
              (unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               *)pIVar2);
  std::
  unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~unordered_map((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)0x1d36c2);
  CalculatePosition(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  if (9 < *(int *)(in_RDI + 0x78)) {
    for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x2c); local_10c = local_10c + 1) {
      MPI_Barrier(*(undefined8 *)(in_RDI + 0x18));
      if (local_10c == *(int *)(in_RDI + 0x28)) {
        std::__cxx11::to_string((int)((ulong)paVar6 >> 0x20));
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffe4c,uVar5),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe44,iVar4));
        PrintRankPosMap((RankPosMap *)m,label);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
      }
    }
    MPI_Barrier(*(undefined8 *)(in_RDI + 0x18));
  }
  Buffer::~Buffer((Buffer *)CONCAT44(in_stack_fffffffffffffe44,iVar4));
  return;
}

Assistant:

void SscWriterGeneric::SyncReadPattern()
{

    helper::Log("Engine", "SscWriter", "SyncReadPattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer globalBuffer;

    ssc::BroadcastMetadata(globalBuffer, m_ReaderMasterStreamRank, m_StreamComm);

    m_ReaderSelectionsLocked = globalBuffer[1];

    ssc::Deserialize(globalBuffer, m_GlobalReadPattern, m_IO, false, false, false,
                     m_StructDefinitions);
    m_AllSendingReaderRanks =
        ssc::CalculateOverlap(m_GlobalReadPattern, m_GlobalWritePattern[m_StreamRank]);
    CalculatePosition(m_GlobalWritePattern, m_GlobalReadPattern, m_WriterRank,
                      m_AllSendingReaderRanks);

    if (m_Verbosity >= 10)
    {
        for (int i = 0; i < m_WriterSize; ++i)
        {
            MPI_Barrier(m_WriterComm);
            if (i == m_WriterRank)
            {
                ssc::PrintRankPosMap(m_AllSendingReaderRanks,
                                     "Rank Pos Map for Writer " + std::to_string(m_WriterRank));
            }
        }
        MPI_Barrier(m_WriterComm);
    }
}